

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

void __thiscall de::Random::shuffle<int*>(Random *this,int *first,int *last)

{
  int iVar1;
  int iVar2;
  uint max;
  ulong uVar3;
  
  uVar3 = (ulong)((long)last - (long)first) >> 2 & 0xffffffff;
  while( true ) {
    uVar3 = uVar3 - 1;
    max = (uint)uVar3;
    if ((int)max < 1) break;
    iVar2 = getInt(this,0,max);
    iVar1 = first[max & 0x7fffffff];
    first[max & 0x7fffffff] = first[iVar2];
    first[iVar2] = iVar1;
  }
  return;
}

Assistant:

void Random::shuffle (Iterator first, Iterator last)
{
	using std::swap;

	// Fisher-Yates suffle
	int numItems = (int)std::distance(first, last);

	for (int i = numItems-1; i >= 1; i--)
	{
		int j = getInt(0, i);
		swap(*(first + i), *(first + j));
	}
}